

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void duckdb::ColumnDataCopy<duckdb::hugeint_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  byte bVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  hugeint_t *source_data_2;
  reference pvVar8;
  ulong uVar9;
  ColumnDataAllocator *this_01;
  data_ptr_t pdVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  VectorDataIndex prev_index;
  idx_t iVar12;
  long lVar13;
  idx_t iVar14;
  hugeint_t *result_data;
  long lVar15;
  ulong uVar16;
  _Head_base<0UL,_unsigned_long_*,_false> local_88;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_80;
  unsigned_long local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  long local_50;
  ulong local_48;
  idx_t local_40;
  unsigned_long local_38;
  
  if (copy_count != 0) {
    this = meta_data->segment;
    state = meta_data->state;
    prev_index.index = (meta_data->vector_data_index).index;
    do {
      pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,prev_index.index)
      ;
      uVar16 = (ulong)(0x800 - pvVar8->count);
      uVar9 = copy_count;
      if (uVar16 < copy_count) {
        uVar9 = uVar16;
      }
      this_01 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      pdVar10 = ColumnDataAllocator::GetDataPointer
                          (this_01,&state->current_chunk_state,pvVar8->block_id,pvVar8->offset);
      local_88._M_head_impl = (unsigned_long *)(pdVar10 + 0x8000);
      local_80.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_80.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70 = 0x800;
      if (pvVar8->count == 0) {
        switchD_005700f1::default(local_88._M_head_impl,0xff,0x100);
      }
      local_48 = copy_count;
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar16 != 0) {
          pdVar4 = source_data->data;
          uVar1 = pvVar8->count;
          psVar2 = source_data->sel->sel_vector;
          lVar13 = 0;
          iVar12 = offset;
          do {
            iVar14 = iVar12;
            if (psVar2 != (sel_t *)0x0) {
              iVar14 = (idx_t)psVar2[iVar12];
            }
            uVar6 = *(undefined8 *)(pdVar4 + iVar14 * 0x10 + 8);
            *(undefined8 *)(pdVar10 + lVar13 + (ulong)uVar1 * 0x10) =
                 *(undefined8 *)(pdVar4 + iVar14 * 0x10);
            *(undefined8 *)(pdVar10 + lVar13 + (ulong)uVar1 * 0x10 + 8) = uVar6;
            lVar13 = lVar13 + 0x10;
            iVar12 = iVar12 + 1;
          } while ((uVar9 + (uVar9 == 0)) * 0x10 != lVar13);
        }
      }
      else if (uVar16 != 0) {
        lVar13 = offset * 4;
        lVar15 = 0;
        local_50 = lVar13;
        local_40 = offset;
        do {
          psVar2 = source_data->sel->sel_vector;
          if (psVar2 == (sel_t *)0x0) {
            uVar16 = offset + lVar15;
          }
          else {
            uVar16 = (ulong)*(uint *)((long)psVar2 + lVar15 * 4 + lVar13);
          }
          puVar3 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 == (unsigned_long *)0x0) ||
             ((puVar3[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)) {
            uVar1 = pvVar8->count;
            uVar6 = *(undefined8 *)(source_data->data + uVar16 * 0x10 + 8);
            *(undefined8 *)(pdVar10 + (ulong)uVar1 * 0x10) =
                 *(undefined8 *)(source_data->data + uVar16 * 0x10);
            *(undefined8 *)(pdVar10 + (ulong)uVar1 * 0x10 + 8) = uVar6;
          }
          else {
            uVar1 = pvVar8->count;
            if (local_88._M_head_impl == (unsigned_long *)0x0) {
              local_38 = local_70;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_38);
              p_Var7 = p_Stack_60;
              local_80.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_68;
              this_00._M_pi =
                   local_80.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              local_68 = (element_type *)0x0;
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_80.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var7;
              if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
              }
              if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
              }
              pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&local_80);
              local_88._M_head_impl =
                   (pTVar11->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar13 = local_50;
            }
            uVar16 = (ulong)uVar1 + lVar15;
            bVar5 = (byte)uVar16 & 0x3f;
            local_88._M_head_impl[uVar16 >> 6] =
                 local_88._M_head_impl[uVar16 >> 6] &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            offset = local_40;
          }
          lVar15 = lVar15 + 1;
          pdVar10 = pdVar10 + 0x10;
        } while (uVar9 + (uVar9 == 0) != lVar15);
      }
      pvVar8->count = pvVar8->count + (short)uVar9;
      copy_count = local_48 - uVar9;
      if (copy_count != 0) {
        if ((pvVar8->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index
                    );
        }
        pvVar8 = vector<duckdb::VectorMetaData,_true>::operator[]
                           (&this->vector_data,prev_index.index);
        prev_index.index = (pvVar8->next_data).index;
      }
      if (local_80.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      offset = offset + uVar9;
    } while (copy_count != 0);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}